

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O3

void __thiscall QThreadPool::setMaxThreadCount(QThreadPool *this,int maxThreadCount)

{
  __base_type copy;
  QThreadPoolPrivate *this_00;
  QMutex *this_01;
  bool bVar1;
  
  this_00 = (QThreadPoolPrivate *)(this->super_QObject).d_ptr.d;
  this_01 = &this_00->mutex;
  if ((this_00->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar1 = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar1) {
      (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar1) goto LAB_003c841d;
  }
  QBasicMutex::lockInternal(&this_01->super_QBasicMutex);
LAB_003c841d:
  if (this_00->requestedMaxThreadCount != maxThreadCount) {
    this_00->requestedMaxThreadCount = maxThreadCount;
    QThreadPoolPrivate::tryToStartMoreThreads(this_00);
  }
  LOCK();
  copy._M_p = (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_01->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy._M_p != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_01->super_QBasicMutex,copy._M_p);
    return;
  }
  return;
}

Assistant:

void QThreadPool::setMaxThreadCount(int maxThreadCount)
{
    Q_D(QThreadPool);
    QMutexLocker locker(&d->mutex);

    if (maxThreadCount == d->requestedMaxThreadCount)
        return;

    d->requestedMaxThreadCount = maxThreadCount;
    d->tryToStartMoreThreads();
}